

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_14c7fc::DistortionState::update
          (DistortionState *this,ALCcontext *context,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  ALCdevice *pAVar1;
  pointer paVar2;
  MixParams *mix;
  float fVar3;
  float fVar4;
  float local_78 [4];
  array<float,_16UL> coeffs;
  
  mix = target.Main;
  pAVar1 = (context->mDevice).mPtr;
  fVar3 = sinf((props->Reverb).Density * 1.5707964);
  fVar4 = 0.99;
  if (fVar3 <= 0.99) {
    fVar4 = fVar3;
  }
  this->mEdgeCoeff = (fVar4 + fVar4) / (1.0 - fVar4);
  fVar4 = (props->Reverb).Gain;
  fVar3 = (float)pAVar1->Frequency;
  BiquadFilterR<float>::setParamsFromBandwidth
            (&this->mLowpass,LowPass,(fVar4 / fVar3) * 0.25,1.0,(fVar4 * 0.5) / (fVar4 * 0.67));
  BiquadFilterR<float>::setParamsFromBandwidth
            (&this->mBandpass,BandPass,((props->Reverb).GainHF / fVar3) * 0.25,1.0,
             (props->Reverb).DecayTime / ((props->Reverb).GainHF * 0.67));
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = -1.0;
  CalcDirectionCoeffs((array<float,_16UL> *)&coeffs,(float (*) [3])local_78,0.0);
  paVar2 = (mix->Buffer).mDataEnd;
  (this->super_EffectState).mOutTarget.mData = (mix->Buffer).mData;
  (this->super_EffectState).mOutTarget.mDataEnd = paVar2;
  ComputePanGains(mix,(float *)&coeffs,slot->Gain * (props->Reverb).Diffusion,
                  (span<float,_16UL>)this->mGain);
  return;
}

Assistant:

void DistortionState::update(const ALCcontext *context, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const ALCdevice *device{context->mDevice.get()};

    /* Store waveshaper edge settings. */
    const float edge{minf(std::sin(al::MathDefs<float>::Pi()*0.5f * props->Distortion.Edge),
        0.99f)};
    mEdgeCoeff = 2.0f * edge / (1.0f-edge);

    float cutoff{props->Distortion.LowpassCutoff};
    /* Bandwidth value is constant in octaves. */
    float bandwidth{(cutoff / 2.0f) / (cutoff * 0.67f)};
    /* Divide normalized frequency by the amount of oversampling done during
     * processing.
     */
    auto frequency = static_cast<float>(device->Frequency);
    mLowpass.setParamsFromBandwidth(BiquadType::LowPass, cutoff/frequency/4.0f, 1.0f, bandwidth);

    cutoff = props->Distortion.EQCenter;
    /* Convert bandwidth in Hz to octaves. */
    bandwidth = props->Distortion.EQBandwidth / (cutoff * 0.67f);
    mBandpass.setParamsFromBandwidth(BiquadType::BandPass, cutoff/frequency/4.0f, 1.0f, bandwidth);

    const auto coeffs = CalcDirectionCoeffs({0.0f, 0.0f, -1.0f}, 0.0f);

    mOutTarget = target.Main->Buffer;
    ComputePanGains(target.Main, coeffs.data(), slot->Gain*props->Distortion.Gain, mGain);
}